

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

int helicsInputGetOption(HelicsInput inp,int option)

{
  InputObject *pIVar1;
  uint in_ESI;
  InputObject *inpObj;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  HelicsInput in_stack_ffffffffffffffd8;
  int local_4;
  
  pIVar1 = anon_unknown.dwarf_5d1c2::verifyInput
                     (in_stack_ffffffffffffffd8,
                      (HelicsError *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (pIVar1 == (InputObject *)0x0) {
    local_4 = 0;
  }
  else {
    local_4 = (*(pIVar1->inputPtr->super_Interface)._vptr_Interface[3])
                        (pIVar1->inputPtr,(ulong)in_ESI);
  }
  return local_4;
}

Assistant:

int helicsInputGetOption(HelicsInput inp, int option)
{
    auto* inpObj = verifyInput(inp, nullptr);
    if (inpObj == nullptr) {
        return HELICS_FALSE;
    }
    try {
        return (inpObj->inputPtr->getOption(option));
    }
    // LCOV_EXCL_START
    catch (...) {
        return HELICS_FALSE;
    }
    // LCOV_EXCL_STOP
}